

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

shared_ptr<Token> __thiscall Tokenizer::currentToken(Tokenizer *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<Token> sVar1;
  
  std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x28));
  sVar1.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Token>)sVar1.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Token> Tokenizer::currentToken() const noexcept {
  return this->token;
}